

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O3

void Nwk_ManDumpBlif(Nwk_Man_t *pNtk,char *pFileName,Vec_Ptr_t *vPiNames,Vec_Ptr_t *vPoNames)

{
  void *pvVar1;
  long *plVar2;
  Tim_Man_t *p;
  bool bVar3;
  int iVar4;
  uint uVar5;
  FILE *__s;
  Aig_MmFlex_t *p_00;
  Vec_Int_t *vTruth;
  int *piVar6;
  Vec_Int_t *vCover;
  Vec_Ptr_t *pVVar7;
  uint *pTruth;
  ulong uVar8;
  char *__s_00;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  long lVar12;
  
  iVar4 = Nwk_ManPoNum(pNtk);
  if (iVar4 == 0) {
    puts("Nwk_ManDumpBlif(): Network does not have POs.");
    return;
  }
  uVar11 = pNtk->vObjs->nSize;
  if (1 < uVar11) {
    uVar5 = uVar11 - 1;
    uVar11 = 0;
    do {
      uVar11 = uVar11 + 1;
      bVar3 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar3);
  }
  __s = fopen(pFileName,"w");
  fwrite("# BLIF file written by procedure Nwk_ManDumpBlif()\n",0x33,1,__s);
  fprintf(__s,".model %s\n",pNtk->pName);
  fwrite(".inputs",7,1,__s);
  pVVar7 = pNtk->vCis;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      if (vPiNames == (Vec_Ptr_t *)0x0) {
        fprintf(__s," n%0*d",(ulong)uVar11,(ulong)*(uint *)((long)pVVar7->pArray[lVar10] + 0x24));
      }
      else {
        if (vPiNames->nSize <= lVar10) goto LAB_004a1db7;
        fprintf(__s," %s",vPiNames->pArray[lVar10]);
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vCis;
    } while (lVar10 < pVVar7->nSize);
  }
  fputc(10,__s);
  fwrite(".outputs",8,1,__s);
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      if (vPoNames == (Vec_Ptr_t *)0x0) {
        fprintf(__s," n%0*d",(ulong)uVar11,(ulong)*(uint *)((long)pVVar7->pArray[lVar10] + 0x24));
      }
      else {
        if (vPoNames->nSize <= lVar10) goto LAB_004a1db7;
        fprintf(__s," %s",vPoNames->pArray[lVar10]);
      }
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar10 < pVVar7->nSize);
  }
  fputc(10,__s);
  p_00 = Aig_MmFlexStart();
  vTruth = (Vec_Int_t *)malloc(0x10);
  vTruth->nCap = 0x10000;
  vTruth->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vTruth->pArray = piVar6;
  vCover = (Vec_Int_t *)malloc(0x10);
  vCover->nCap = 0x10000;
  vCover->nSize = 0;
  piVar6 = (int *)malloc(0x40000);
  vCover->pArray = piVar6;
  pVVar7 = Nwk_ManDfs(pNtk);
  iVar4 = pVVar7->nSize;
  if (0 < iVar4) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar10];
      if ((*(uint *)((long)pvVar1 + 0x20) & 7) == 3) {
        pTruth = Hop_ManConvertAigToTruth
                           (pNtk->pManHop,
                            (Hop_Obj_t *)(*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe),
                            *(int *)((long)pvVar1 + 0x3c),vTruth,0);
        iVar4 = *(int *)((long)pvVar1 + 0x3c);
        if ((*(byte *)((long)pvVar1 + 8) & 1) != 0) {
          uVar5 = 1 << ((char)iVar4 - 5U & 0x1f);
          if (iVar4 < 6) {
            uVar5 = 1;
          }
          if (0 < (int)uVar5) {
            uVar8 = (ulong)uVar5 + 1;
            do {
              pTruth[uVar8 - 2] = ~pTruth[uVar8 - 2];
              uVar8 = uVar8 - 1;
            } while (1 < uVar8);
            iVar4 = *(int *)((long)pvVar1 + 0x3c);
          }
        }
        __s_00 = Kit_PlaFromTruth(p_00,pTruth,iVar4,vCover);
        fwrite(".names",6,1,__s);
        iVar4 = *(int *)((long)pvVar1 + 0x3c);
        uVar5 = 1 << ((char)iVar4 - 5U & 0x1f);
        if (iVar4 < 6) {
          uVar5 = 1;
        }
        uVar9 = (ulong)uVar5;
        uVar8 = uVar9;
        do {
          if ((int)uVar8 < 1) goto LAB_004a1b8a;
          lVar12 = uVar8 - 1;
          uVar8 = uVar8 - 1;
        } while (pTruth[lVar12] == 0);
        do {
          if ((int)uVar9 < 1) goto LAB_004a1b8a;
          lVar12 = uVar9 - 1;
          uVar9 = uVar9 - 1;
        } while (pTruth[lVar12] == 0xffffffff);
        if (0 < iVar4) {
          lVar12 = 0;
          do {
            plVar2 = *(long **)(*(long *)((long)pvVar1 + 0x48) + lVar12 * 8);
            if (plVar2 == (long *)0x0) break;
            if ((vPiNames == (Vec_Ptr_t *)0x0) || (uVar5 = *(uint *)(plVar2 + 4), (uVar5 & 7) != 1))
            {
LAB_004a1b38:
              fprintf(__s," n%0*d",(ulong)uVar11,(ulong)*(uint *)((long)plVar2 + 0x24));
            }
            else {
              if (*(Tim_Man_t **)(*plVar2 + 0x48) != (Tim_Man_t *)0x0) {
                iVar4 = Tim_ManBoxForCi(*(Tim_Man_t **)(*plVar2 + 0x48),uVar5 >> 7);
                if (iVar4 != -1) goto LAB_004a1b38;
                uVar5 = *(uint *)(plVar2 + 4);
              }
              if (vPiNames->nSize <= (int)(uVar5 >> 7)) goto LAB_004a1db7;
              fprintf(__s," %s",vPiNames->pArray[uVar5 >> 7]);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < *(int *)((long)pvVar1 + 0x3c));
        }
LAB_004a1b8a:
        fprintf(__s," n%0*d\n",(ulong)uVar11,(ulong)*(uint *)((long)pvVar1 + 0x24));
        fputs(__s_00,__s);
        iVar4 = pVVar7->nSize;
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < iVar4);
  }
  if (vCover->pArray != (int *)0x0) {
    free(vCover->pArray);
  }
  free(vCover);
  if (vTruth->pArray != (int *)0x0) {
    free(vTruth->pArray);
  }
  free(vTruth);
  if (pVVar7->pArray != (void **)0x0) {
    free(pVVar7->pArray);
  }
  free(pVVar7);
  Aig_MmFlexStop(p_00,0);
  pVVar7 = pNtk->vCos;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      pvVar1 = pVVar7->pArray[lVar10];
      fwrite(".names",6,1,__s);
      if (vPiNames == (Vec_Ptr_t *)0x0) {
LAB_004a1ca0:
        fprintf(__s," n%0*d",(ulong)uVar11,(ulong)*(uint *)(**(long **)((long)pvVar1 + 0x48) + 0x24)
               );
      }
      else {
        uVar5 = *(uint *)((long *)**(long **)((long)pvVar1 + 0x48) + 4);
        if ((uVar5 & 7) != 1) goto LAB_004a1ca0;
        p = *(Tim_Man_t **)(*(long *)**(long **)((long)pvVar1 + 0x48) + 0x48);
        if (p != (Tim_Man_t *)0x0) {
          iVar4 = Tim_ManBoxForCi(p,uVar5 >> 7);
          if (iVar4 != -1) goto LAB_004a1ca0;
          uVar5 = *(uint *)(**(long **)((long)pvVar1 + 0x48) + 0x20);
        }
        if (vPiNames->nSize <= (int)(uVar5 >> 7)) {
LAB_004a1db7:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        fprintf(__s," %s",vPiNames->pArray[uVar5 >> 7]);
      }
      if (vPoNames == (Vec_Ptr_t *)0x0) {
        fprintf(__s," n%0*d\n",(ulong)uVar11,(ulong)*(uint *)((long)pvVar1 + 0x24));
      }
      else {
        uVar5 = *(uint *)((long)pvVar1 + 0x20) >> 7;
        if (vPoNames->nSize <= (int)uVar5) goto LAB_004a1db7;
        fprintf(__s," %s\n",vPoNames->pArray[uVar5]);
      }
      fprintf(__s,"%d 1\n",(ulong)((*(byte *)((long)pvVar1 + 0x20) & 8) == 0));
      lVar10 = lVar10 + 1;
      pVVar7 = pNtk->vCos;
    } while (lVar10 < pVVar7->nSize);
  }
  fwrite(".end\n\n",6,1,__s);
  fclose(__s);
  return;
}

Assistant:

void Nwk_ManDumpBlif( Nwk_Man_t * pNtk, char * pFileName, Vec_Ptr_t * vPiNames, Vec_Ptr_t * vPoNames )
{
    FILE * pFile;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vTruth;
    Vec_Int_t * vCover;
    Nwk_Obj_t * pObj, * pFanin;
    Aig_MmFlex_t * pMem;
    char * pSop = NULL;
    unsigned * pTruth;
    int i, k, nDigits;
    if ( Nwk_ManPoNum(pNtk) == 0 )
    {
        printf( "Nwk_ManDumpBlif(): Network does not have POs.\n" );
        return;
    }
    // collect nodes in the DFS order
    nDigits = Abc_Base10Log( Nwk_ManObjNumMax(pNtk) );
    // write the file 
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# BLIF file written by procedure Nwk_ManDumpBlif()\n" );
//    fprintf( pFile, "# http://www.eecs.berkeley.edu/~alanmi/abc/\n" );
    fprintf( pFile, ".model %s\n", pNtk->pName );
    // write PIs
    fprintf( pFile, ".inputs" );
    Nwk_ManForEachCi( pNtk, pObj, i )
        if ( vPiNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write POs
    fprintf( pFile, ".outputs" );
    Nwk_ManForEachCo( pNtk, pObj, i )
        if ( vPoNames )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPoNames, i) );
        else
            fprintf( pFile, " n%0*d", nDigits, pObj->Id );
    fprintf( pFile, "\n" );
    // write nodes
    pMem = Aig_MmFlexStart();
    vTruth = Vec_IntAlloc( 1 << 16 );
    vCover = Vec_IntAlloc( 1 << 16 );
    vNodes = Nwk_ManDfs( pNtk );
    Vec_PtrForEachEntry( Nwk_Obj_t *, vNodes, pObj, i )
    {
        if ( !Nwk_ObjIsNode(pObj) )
            continue;
        // derive SOP for the AIG
        pTruth = Hop_ManConvertAigToTruth( pNtk->pManHop, Hop_Regular(pObj->pFunc), Nwk_ObjFaninNum(pObj), vTruth, 0 );
        if ( Hop_IsComplement(pObj->pFunc) )
            Kit_TruthNot( pTruth, pTruth, Nwk_ObjFaninNum(pObj) );
        pSop = Kit_PlaFromTruth( pMem, pTruth, Nwk_ObjFaninNum(pObj), vCover );
        // write the node
        fprintf( pFile, ".names" );
        if ( !Kit_TruthIsConst0(pTruth, Nwk_ObjFaninNum(pObj)) && !Kit_TruthIsConst1(pTruth, Nwk_ObjFaninNum(pObj)) )
        {
            Nwk_ObjForEachFanin( pObj, pFanin, k )
                if ( vPiNames && Nwk_ObjIsPi(pFanin) )
                    fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(pFanin)) );
                else
                    fprintf( pFile, " n%0*d", nDigits, pFanin->Id );
        }
        fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        // write the function
        fprintf( pFile, "%s", pSop );
    }
    Vec_IntFree( vCover );
    Vec_IntFree( vTruth );
    Vec_PtrFree( vNodes );
    Aig_MmFlexStop( pMem, 0 );
    // write POs
    Nwk_ManForEachCo( pNtk, pObj, i )
    {
        fprintf( pFile, ".names" );
        if ( vPiNames && Nwk_ObjIsPi(Nwk_ObjFanin0(pObj)) )
            fprintf( pFile, " %s", (char*)Vec_PtrEntry(vPiNames, Nwk_ObjPioNum(Nwk_ObjFanin0(pObj))) );
        else
            fprintf( pFile, " n%0*d", nDigits, Nwk_ObjFanin0(pObj)->Id );
        if ( vPoNames )
            fprintf( pFile, " %s\n", (char*)Vec_PtrEntry(vPoNames, Nwk_ObjPioNum(pObj)) );
        else
            fprintf( pFile, " n%0*d\n", nDigits, pObj->Id );
        fprintf( pFile, "%d 1\n", !pObj->fInvert );
    }
    fprintf( pFile, ".end\n\n" );
    fclose( pFile );
}